

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_matrix_z2_ru_vine.cpp
# Opt level: O0

void __thiscall
RU_matrix_z2_vine_row_access<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
::test_method(RU_matrix_z2_vine_row_access<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
              *this)

{
  undefined1 local_240 [8];
  Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  RU_matrix_z2_vine_row_access<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
  *this_local;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>
              *)local_240,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.operators_,0xb);
  test_non_base_row_access<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>>
            ((Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>
              *)local_240);
  test_ru_u_row_access<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>
  ::~Matrix((Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>
             *)local_240);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.operators_);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(RU_matrix_z2_vine_row_access, Matrix, row_access_matrices) {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns);
  test_non_base_row_access<Matrix>(m);
  test_ru_u_row_access<Matrix>();
}